

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

bool __thiscall QPDFObjectHandle::getValueAsReal(QPDFObjectHandle *this,string *value)

{
  bool bVar1;
  element_type *this_00;
  string local_40;
  string *local_20;
  string *value_local;
  QPDFObjectHandle *this_local;
  
  local_20 = value;
  value_local = (string *)this;
  bVar1 = isReal(this);
  if (bVar1) {
    this_00 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    QPDFObject::getStringValue_abi_cxx11_(&local_40,this_00);
    std::__cxx11::string::operator=((string *)local_20,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return bVar1;
}

Assistant:

bool
QPDFObjectHandle::getValueAsReal(std::string& value) const
{
    if (!isReal()) {
        return false;
    }
    value = obj->getStringValue();
    return true;
}